

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O3

void __thiscall
nuraft::snapshot_io_mgr::io_queue_elem::io_queue_elem
          (io_queue_elem *this,ptr<raft_server> *r,ptr<snapshot> *s,ptr<snapshot_sync_ctx> *c,
          ptr<peer> *p,
          function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
          *h)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->raft_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (r->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (r->super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->raft_).super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (s->super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->snapshot_).super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->sync_ctx_).super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (c->super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (c->super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->sync_ctx_).super___shared_ptr<nuraft::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (p->super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->dst_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::
  function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>::
  function(&this->handler_,h);
  return;
}

Assistant:

io_queue_elem( ptr<raft_server> r,
                   ptr<snapshot> s,
                   ptr<snapshot_sync_ctx> c,
                   ptr<peer> p,
                   std::function< void(ptr<resp_msg>&, ptr<rpc_exception>&) >& h )
        : raft_(r)
        , snapshot_(s)
        , sync_ctx_(c)
        , dst_(p)
        , handler_(h)
        {}